

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ChargeType charge;
  MassType mass;
  PositionType position;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_90;
  double local_88;
  double local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  local_50 = &DAT_c028ae147ae147ae;
  local_48 = _DAT_001c9460;
  local_38 = 0x40fe078000000000;
  local_58 = &DAT_3a520b016873bbd3;
  local_60 = &DAT_be0080f172b1f37d;
  dVar5 = *pica::ParticleTypes::types * 29979245800.0;
  local_80 = 123000.0 / dVar5;
  auVar1._8_8_ = dVar5;
  auVar1._0_8_ = dVar5;
  local_78._0_16_ = divpd(_DAT_001c9460,auVar1);
  dVar5 = local_80 * local_80 + local_78._0_8_ * local_78._0_8_ + local_78._8_8_ * local_78._8_8_ +
          1.0;
  if (dVar5 < 0.0) {
    sqrt(dVar5);
  }
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_c028ae147ae147ae;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_98,"position[d]","particle.getPosition()[d]",(double *)&local_50,
             (double *)&local_a8);
  if (local_98.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (sStack_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x4b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78._0_8_ = (double)local_78._0_8_ * 29979245800.0;
    local_78._8_8_ = (double)local_78._8_8_ * 29979245800.0;
    local_80 = local_80 * 29979245800.0;
    lVar3 = 0;
    do {
      dVar5 = *pica::ParticleTypes::types;
      local_88 = local_80 * dVar5;
      local_98.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (dVar5 * (double)local_78._0_8_);
      sStack_90.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (dVar5 * (double)local_78._8_8_);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_a8,"momentum[d]","particle.getMomentum()[d]",
                 (double *)(local_48 + lVar3),(double *)((long)&local_98.ptr_ + lVar3));
      if (local_a8.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        if (local_a0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x4c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_98.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_98.ptr_ + 8))();
          }
          local_98.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    local_a8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         *pica::ParticleTypes::types;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_98,"mass","particle.getMass()",(double *)&local_58,
               (double *)&local_a8);
    if (local_98.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      if (sStack_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x4d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_a8.ptr_ + 8))();
        }
        local_a8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pica::ParticleTypes::types[1];
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_98,"charge","particle.getCharge()",(double *)&local_60,
                 (double *)&local_a8);
      if (local_98.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (sStack_90.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x4e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_a8.ptr_ + 8))();
          }
          local_a8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_a8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_3ff0000000000000;
        local_b0.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&local_98,"static_cast<FactorType>(1.0)","particle.getFactor()",
                   (double *)&local_a8,(double *)&local_b0);
        if (local_98.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_a8);
          if (sStack_90.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                     ,0x4f,pcVar4);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_a8.ptr_ + 8))();
            }
            local_a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, ConstructorDefaultFactor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(-12.34, 0.2, 423.12e-2);
    MomentumType momentum(3254.23, -123.324, 1.23e5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    ParticleType particle(position, momentum);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
}